

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHtmlElement.cpp
# Opt level: O0

void __thiscall KDReports::HtmlElement::build(HtmlElement *this,ReportBuilder *builder)

{
  bool bVar1;
  int pos;
  int valueLength;
  QTextCursor *pQVar2;
  pointer pHVar3;
  TextDocumentData *this_00;
  int charPosition;
  QTextCursor *cursor;
  ReportBuilder *builder_local;
  HtmlElement *this_local;
  
  pQVar2 = ReportBuilder::cursor(builder);
  pos = QTextCursor::position();
  std::
  unique_ptr<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>::
  operator->(&this->d);
  QTextCursor::insertHtml((QString *)pQVar2);
  pHVar3 = std::
           unique_ptr<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
           ::operator->(&this->d);
  bVar1 = QString::isEmpty(&pHVar3->m_id);
  if (!bVar1) {
    this_00 = ReportBuilder::currentDocumentData(builder);
    pHVar3 = std::
             unique_ptr<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
             ::operator->(&this->d);
    valueLength = QTextCursor::position();
    TextDocumentData::setTextValueMarker(this_00,pos,&pHVar3->m_id,valueLength,false);
  }
  return;
}

Assistant:

void KDReports::HtmlElement::build(ReportBuilder &builder) const
{
    QTextCursor &cursor = builder.cursor();
    const int charPosition = cursor.position();
    cursor.insertHtml(d->m_html);
    if (!d->m_id.isEmpty())
        builder.currentDocumentData().setTextValueMarker(charPosition, d->m_id, cursor.position(), false);
}